

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O0

void __thiscall front::symbolTable::SymbolTable::push_symbol(SymbolTable *this,SharedSyPtr *symbol)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  Symbol *this_00;
  mapped_type *__x;
  SymbolTable *in_RSI;
  long in_RDI;
  Symbol *in_stack_ffffffffffffff48;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>_>
  *this_01;
  value_type *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 local_70 [112];
  
  peVar3 = std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x29d4fb);
  iVar1 = front::symbol::Symbol::getLayerNum(peVar3);
  std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x29d511);
  front::symbol::Symbol::getName_abi_cxx11_(in_stack_ffffffffffffff48);
  find_least_layer_symbol
            (in_RSI,(string *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  peVar3 = std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x29d549);
  iVar2 = front::symbol::Symbol::getLayerNum(peVar3);
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x29d564)
  ;
  std::__cxx11::string::~string((string *)(local_70 + 0x30));
  if (iVar1 != iVar2) {
    std::
    vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
    ::push_back((vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
                 *)CONCAT44(iVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
    this_00 = (Symbol *)(in_RDI + 0x18);
    std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x29d5a4);
    this_01 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>_>
               *)local_70;
    front::symbol::Symbol::getName_abi_cxx11_(this_00);
    __x = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>_>
          ::operator[](this_01,(key_type *)this_00);
    std::
    vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
    ::push_back((vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
                 *)CONCAT44(iVar2,in_stack_ffffffffffffff60),(value_type *)__x);
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void SymbolTable::push_symbol(SharedSyPtr symbol) {
  if (symbol->getLayerNum() !=
      find_least_layer_symbol(symbol->getName())->getLayerNum()) {
    symbol_stack.push_back(symbol);
    symbol_map[symbol->getName()].push_back(symbol);
  }
}